

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgmesh.cpp
# Opt level: O1

TPZGeoEl * __thiscall
TPZGeoMesh::CreateGeoElement
          (TPZGeoMesh *this,MElementType type,TPZVec<long> *nodeindexes,int matid,int64_t *index,
          int reftype)

{
  long *plVar1;
  TPZGeoElRefPattern<pzgeom::TPZGeoCube> *this_00;
  
  if (reftype == 0) {
    switch(type) {
    case EPoint:
      this_00 = (TPZGeoElRefPattern<pzgeom::TPZGeoCube> *)operator_new(0x70);
      *(undefined ***)&(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).super_TPZGeoEl =
           &PTR__TPZSavable_01934fe8;
      TPZGeoElRefLess<pzgeom::TPZGeoPoint>::TPZGeoElRefLess
                ((TPZGeoElRefLess<pzgeom::TPZGeoPoint> *)this_00,&PTR_PTR_019348d8,nodeindexes,matid
                 ,this,index);
      *(undefined ***)&(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).super_TPZGeoEl =
           &PTR__TPZGeoElement_019345d8;
      (this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).fGeo.
      super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes[4] = 0xffffffffffffffff;
      break;
    case EOned:
      this_00 = (TPZGeoElRefPattern<pzgeom::TPZGeoCube> *)operator_new(0xb0);
      *(undefined ***)&(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).super_TPZGeoEl =
           &PTR__TPZSavable_01935ab8;
      TPZGeoElRefLess<pzgeom::TPZGeoLinear>::TPZGeoElRefLess
                ((TPZGeoElRefLess<pzgeom::TPZGeoLinear> *)this_00,&PTR_PTR_019353a8,nodeindexes,
                 matid,this,index);
      *(undefined ***)&(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).super_TPZGeoEl =
           &PTR__TPZGeoElement_019350a8;
      *(undefined4 *)
       &(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).fNeighbours[1].super_TPZSavable.
        _vptr_TPZSavable = 0xffffffff;
      *(undefined4 *)
       ((long)&(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).fNeighbours[1].super_TPZSavable.
               _vptr_TPZSavable + 4) = 0xffffffff;
      *(int *)&(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).fNeighbours[1].fGeoElIndex = -1;
      *(undefined4 *)
       ((long)&(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).fNeighbours[1].fGeoElIndex + 4)
           = 0xffffffff;
      break;
    case ETriangle:
      this_00 = (TPZGeoElRefPattern<pzgeom::TPZGeoCube> *)operator_new(0x128);
      *(undefined ***)&(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).super_TPZGeoEl =
           &PTR__TPZSavable_01936588;
      TPZGeoElRefLess<pzgeom::TPZGeoTriangle>::TPZGeoElRefLess
                ((TPZGeoElRefLess<pzgeom::TPZGeoTriangle> *)this_00,&PTR_PTR_01935e78,nodeindexes,
                 matid,this,index);
      *(undefined ***)&(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).super_TPZGeoEl =
           &PTR__TPZGeoElement_01935b78;
      *(int *)&(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).fNeighbours[5].fGeoElIndex = -1;
      *(undefined4 *)
       ((long)&(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).fNeighbours[5].fGeoElIndex + 4)
           = 0xffffffff;
      (this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).fNeighbours[5].fSide = -1;
      *(undefined4 *)&(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).fNeighbours[5].field_0x14
           = 0xffffffff;
      *(undefined4 *)
       &(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).fNeighbours[6].super_TPZSavable.
        _vptr_TPZSavable = 0xffffffff;
      *(undefined4 *)
       ((long)&(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).fNeighbours[6].super_TPZSavable.
               _vptr_TPZSavable + 4) = 0xffffffff;
      *(int *)&(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).fNeighbours[6].fGeoElIndex = -1;
      *(undefined4 *)
       ((long)&(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).fNeighbours[6].fGeoElIndex + 4)
           = 0xffffffff;
      break;
    case EQuadrilateral:
      this_00 = (TPZGeoElRefPattern<pzgeom::TPZGeoCube> *)operator_new(0x160);
      *(undefined ***)&(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).super_TPZGeoEl =
           &PTR__TPZSavable_01937058;
      TPZGeoElRefLess<pzgeom::TPZGeoQuad>::TPZGeoElRefLess
                ((TPZGeoElRefLess<pzgeom::TPZGeoQuad> *)this_00,&PTR_PTR_01936948,nodeindexes,matid,
                 this,index);
      *(undefined ***)&(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).super_TPZGeoEl =
           &PTR__TPZGeoElement_01936648;
      (this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).fNeighbours[7].fSide = -1;
      *(undefined4 *)&(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).fNeighbours[7].field_0x14
           = 0xffffffff;
      *(undefined4 *)
       &(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).fNeighbours[8].super_TPZSavable.
        _vptr_TPZSavable = 0xffffffff;
      *(undefined4 *)
       ((long)&(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).fNeighbours[8].super_TPZSavable.
               _vptr_TPZSavable + 4) = 0xffffffff;
      *(int *)&(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).fNeighbours[8].fGeoElIndex = -1;
      *(undefined4 *)
       ((long)&(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).fNeighbours[8].fGeoElIndex + 4)
           = 0xffffffff;
      (this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).fNeighbours[8].fSide = -1;
      *(undefined4 *)&(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).fNeighbours[8].field_0x14
           = 0xffffffff;
      break;
    case ETetraedro:
      this_00 = (TPZGeoElRefPattern<pzgeom::TPZGeoCube> *)operator_new(0x200);
      *(undefined ***)&(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).super_TPZGeoEl =
           &PTR__TPZSavable_01937b28;
      TPZGeoElRefLess<pzgeom::TPZGeoTetrahedra>::TPZGeoElRefLess
                ((TPZGeoElRefLess<pzgeom::TPZGeoTetrahedra> *)this_00,&PTR_PTR_01937418,nodeindexes,
                 matid,this,index);
      *(undefined ***)&(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).super_TPZGeoEl =
           &PTR__TPZGeoElement_01937118;
      (this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).fNeighbours[0xd].fSide = -1;
      *(undefined4 *)
       &(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).fNeighbours[0xd].field_0x14 =
           0xffffffff;
      *(undefined4 *)
       &(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).fNeighbours[0xe].super_TPZSavable.
        _vptr_TPZSavable = 0xffffffff;
      *(undefined4 *)
       ((long)&(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).fNeighbours[0xe].
               super_TPZSavable._vptr_TPZSavable + 4) = 0xffffffff;
      *(undefined4 *)
       &(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).fNeighbours[0xe].fGeoElIndex =
           0xffffffff;
      *(undefined4 *)
       ((long)&(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).fNeighbours[0xe].fGeoElIndex + 4
       ) = 0xffffffff;
      (this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).fNeighbours[0xe].fSide = -1;
      *(undefined4 *)
       &(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).fNeighbours[0xe].field_0x14 =
           0xffffffff;
      *(undefined4 *)
       &(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).fNeighbours[0xf].super_TPZSavable.
        _vptr_TPZSavable = 0xffffffff;
      *(undefined4 *)
       ((long)&(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).fNeighbours[0xf].
               super_TPZSavable._vptr_TPZSavable + 4) = 0xffffffff;
      *(undefined4 *)
       &(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).fNeighbours[0xf].fGeoElIndex =
           0xffffffff;
      *(undefined4 *)
       ((long)&(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).fNeighbours[0xf].fGeoElIndex + 4
       ) = 0xffffffff;
      break;
    case EPiramide:
      this_00 = (TPZGeoElRefPattern<pzgeom::TPZGeoCube> *)operator_new(0x288);
      *(undefined ***)&(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).super_TPZGeoEl =
           &PTR__TPZSavable_019385f8;
      TPZGeoElRefLess<pzgeom::TPZGeoPyramid>::TPZGeoElRefLess
                ((TPZGeoElRefLess<pzgeom::TPZGeoPyramid> *)this_00,&PTR_PTR_01937ee8,nodeindexes,
                 matid,this,index);
      *(undefined ***)&(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).super_TPZGeoEl =
           &PTR__TPZGeoElement_01937be8;
      *(undefined4 *)
       &(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).fNeighbours[0x12].super_TPZSavable.
        _vptr_TPZSavable = 0xffffffff;
      *(undefined4 *)
       ((long)&(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).fNeighbours[0x12].
               super_TPZSavable._vptr_TPZSavable + 4) = 0xffffffff;
      *(undefined4 *)
       &(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).fNeighbours[0x12].fGeoElIndex =
           0xffffffff;
      *(undefined4 *)
       ((long)&(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).fNeighbours[0x12].fGeoElIndex +
       4) = 0xffffffff;
      (this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).fNeighbours[0x12].fSide = -1;
      *(undefined4 *)
       &(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).fNeighbours[0x12].field_0x14 =
           0xffffffff;
      *(undefined4 *)
       &(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).fNeighbours[0x13].super_TPZSavable.
        _vptr_TPZSavable = 0xffffffff;
      *(undefined4 *)
       ((long)&(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).fNeighbours[0x13].
               super_TPZSavable._vptr_TPZSavable + 4) = 0xffffffff;
      *(undefined4 *)
       &(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).fNeighbours[0x13].fGeoElIndex =
           0xffffffff;
      *(undefined4 *)
       ((long)&(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).fNeighbours[0x13].fGeoElIndex +
       4) = 0xffffffff;
      (this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).fNeighbours[0x13].fSide = -1;
      *(undefined4 *)
       &(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).fNeighbours[0x13].field_0x14 =
           0xffffffff;
      *(undefined4 *)
       &(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).fNeighbours[0x14].super_TPZSavable.
        _vptr_TPZSavable = 0xffffffff;
      *(undefined4 *)
       ((long)&(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).fNeighbours[0x14].
               super_TPZSavable._vptr_TPZSavable + 4) = 0xffffffff;
      *(undefined4 *)
       &(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).fNeighbours[0x14].fGeoElIndex =
           0xffffffff;
      *(undefined4 *)
       ((long)&(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).fNeighbours[0x14].fGeoElIndex +
       4) = 0xffffffff;
      (this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).fNeighbours[0x14].fSide = -1;
      *(undefined4 *)
       &(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).fNeighbours[0x14].field_0x14 =
           0xffffffff;
      *(undefined4 *)
       &(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).fNeighbours[0x15].super_TPZSavable.
        _vptr_TPZSavable = 0xffffffff;
      *(undefined4 *)
       ((long)&(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).fNeighbours[0x15].
               super_TPZSavable._vptr_TPZSavable + 4) = 0xffffffff;
      break;
    case EPrisma:
      this_00 = (TPZGeoElRefPattern<pzgeom::TPZGeoCube> *)operator_new(0x2b0);
      *(undefined ***)&(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).super_TPZGeoEl =
           &PTR__TPZSavable_019390c8;
      TPZGeoElRefLess<pzgeom::TPZGeoPrism>::TPZGeoElRefLess
                ((TPZGeoElRefLess<pzgeom::TPZGeoPrism> *)this_00,&PTR_PTR_019389b8,nodeindexes,matid
                 ,this,index);
      *(undefined ***)&(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).super_TPZGeoEl =
           &PTR__TPZGeoElement_019386b8;
      *(undefined4 *)
       &(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).fNeighbours[0x14].fGeoElIndex =
           0xffffffff;
      *(undefined4 *)
       ((long)&(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).fNeighbours[0x14].fGeoElIndex +
       4) = 0xffffffff;
      (this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).fNeighbours[0x14].fSide = -1;
      *(undefined4 *)
       &(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).fNeighbours[0x14].field_0x14 =
           0xffffffff;
      *(undefined4 *)
       &(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).fNeighbours[0x15].super_TPZSavable.
        _vptr_TPZSavable = 0xffffffff;
      *(undefined4 *)
       ((long)&(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).fNeighbours[0x15].
               super_TPZSavable._vptr_TPZSavable + 4) = 0xffffffff;
      *(undefined4 *)
       &(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).fNeighbours[0x15].fGeoElIndex =
           0xffffffff;
      *(undefined4 *)
       ((long)&(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).fNeighbours[0x15].fGeoElIndex +
       4) = 0xffffffff;
      (this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).fNeighbours[0x15].fSide = -1;
      *(undefined4 *)
       &(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).fNeighbours[0x15].field_0x14 =
           0xffffffff;
      *(undefined4 *)
       &(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).fNeighbours[0x16].super_TPZSavable.
        _vptr_TPZSavable = 0xffffffff;
      *(undefined4 *)
       ((long)&(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).fNeighbours[0x16].
               super_TPZSavable._vptr_TPZSavable + 4) = 0xffffffff;
      *(undefined4 *)
       &(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).fNeighbours[0x16].fGeoElIndex =
           0xffffffff;
      *(undefined4 *)
       ((long)&(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).fNeighbours[0x16].fGeoElIndex +
       4) = 0xffffffff;
      (this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).fNeighbours[0x16].fSide = -1;
      *(undefined4 *)
       &(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).fNeighbours[0x16].field_0x14 =
           0xffffffff;
      break;
    case ECube:
      this_00 = (TPZGeoElRefPattern<pzgeom::TPZGeoCube> *)operator_new(0x350);
      *(undefined ***)&(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).super_TPZGeoEl =
           &PTR__TPZSavable_01939b98;
      TPZGeoElRefLess<pzgeom::TPZGeoCube>::TPZGeoElRefLess
                ((TPZGeoElRefLess<pzgeom::TPZGeoCube> *)this_00,&PTR_PTR_01939488,nodeindexes,matid,
                 this,index);
      *(undefined ***)&(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).super_TPZGeoEl =
           &PTR__TPZGeoElement_01939188;
      *(undefined4 *)&(this_00->fSubEl)._vptr_TPZVec = 0xffffffff;
      *(undefined4 *)((long)&(this_00->fSubEl)._vptr_TPZVec + 4) = 0xffffffff;
      *(undefined4 *)&(this_00->fSubEl).fStore = 0xffffffff;
      *(undefined4 *)((long)&(this_00->fSubEl).fStore + 4) = 0xffffffff;
      *(undefined4 *)&(this_00->fSubEl).fNElements = 0xffffffff;
      *(undefined4 *)((long)&(this_00->fSubEl).fNElements + 4) = 0xffffffff;
      *(undefined4 *)&(this_00->fSubEl).fNAlloc = 0xffffffff;
      *(undefined4 *)((long)&(this_00->fSubEl).fNAlloc + 4) = 0xffffffff;
      *(undefined4 *)&(this_00->fRefPattern).fRef = 0xffffffff;
      *(undefined4 *)((long)&(this_00->fRefPattern).fRef + 4) = 0xffffffff;
      *(undefined4 *)&this_00[1].super_TPZGeoElRefLess<pzgeom::TPZGeoCube>.super_TPZGeoEl =
           0xffffffff;
      *(undefined4 *)&this_00[1].super_TPZGeoElRefLess<pzgeom::TPZGeoCube>.super_TPZGeoEl.field_0x4
           = 0xffffffff;
      *(undefined4 *)&this_00[1].super_TPZGeoElRefLess<pzgeom::TPZGeoCube>.super_TPZGeoEl.fMesh =
           0xffffffff;
      *(undefined4 *)
       ((long)&this_00[1].super_TPZGeoElRefLess<pzgeom::TPZGeoCube>.super_TPZGeoEl.fMesh + 4) =
           0xffffffff;
      *(undefined4 *)&this_00[1].super_TPZGeoElRefLess<pzgeom::TPZGeoCube>.super_TPZGeoEl.fId =
           0xffffffff;
      *(undefined4 *)
       ((long)&this_00[1].super_TPZGeoElRefLess<pzgeom::TPZGeoCube>.super_TPZGeoEl.fId + 4) =
           0xffffffff;
      break;
    default:
      goto switchD_0110edef_default;
    }
  }
  else {
    switch(type) {
    case EPoint:
      this_00 = (TPZGeoElRefPattern<pzgeom::TPZGeoCube> *)operator_new(0x90);
      TPZGeoElRefPattern<pzgeom::TPZGeoPoint>::TPZGeoElRefPattern
                ((TPZGeoElRefPattern<pzgeom::TPZGeoPoint> *)this_00,nodeindexes,matid,this,index);
      break;
    case EOned:
      this_00 = (TPZGeoElRefPattern<pzgeom::TPZGeoCube> *)operator_new(200);
      TPZGeoElRefPattern<pzgeom::TPZGeoLinear>::TPZGeoElRefPattern
                ((TPZGeoElRefPattern<pzgeom::TPZGeoLinear> *)this_00,nodeindexes,matid,this,index);
      break;
    case ETriangle:
      this_00 = (TPZGeoElRefPattern<pzgeom::TPZGeoCube> *)operator_new(0x130);
      TPZGeoElRefPattern<pzgeom::TPZGeoTriangle>::TPZGeoElRefPattern
                ((TPZGeoElRefPattern<pzgeom::TPZGeoTriangle> *)this_00,nodeindexes,matid,this,index)
      ;
      break;
    case EQuadrilateral:
      this_00 = (TPZGeoElRefPattern<pzgeom::TPZGeoCube> *)operator_new(0x168);
      TPZGeoElRefPattern<pzgeom::TPZGeoQuad>::TPZGeoElRefPattern
                ((TPZGeoElRefPattern<pzgeom::TPZGeoQuad> *)this_00,nodeindexes,matid,this,index);
      break;
    case ETetraedro:
      this_00 = (TPZGeoElRefPattern<pzgeom::TPZGeoCube> *)operator_new(0x1f8);
      TPZGeoElRefPattern<pzgeom::TPZGeoTetrahedra>::TPZGeoElRefPattern
                ((TPZGeoElRefPattern<pzgeom::TPZGeoTetrahedra> *)this_00,nodeindexes,matid,this,
                 index);
      break;
    case EPiramide:
      this_00 = (TPZGeoElRefPattern<pzgeom::TPZGeoCube> *)operator_new(0x260);
      TPZGeoElRefPattern<pzgeom::TPZGeoPyramid>::TPZGeoElRefPattern
                ((TPZGeoElRefPattern<pzgeom::TPZGeoPyramid> *)this_00,nodeindexes,matid,this,index);
      break;
    case EPrisma:
      this_00 = (TPZGeoElRefPattern<pzgeom::TPZGeoCube> *)operator_new(0x298);
      TPZGeoElRefPattern<pzgeom::TPZGeoPrism>::TPZGeoElRefPattern
                ((TPZGeoElRefPattern<pzgeom::TPZGeoPrism> *)this_00,nodeindexes,matid,this,index);
      break;
    case ECube:
      this_00 = (TPZGeoElRefPattern<pzgeom::TPZGeoCube> *)operator_new(0x338);
      TPZGeoElRefPattern<pzgeom::TPZGeoCube>::TPZGeoElRefPattern
                (this_00,nodeindexes,matid,this,index);
      break;
    default:
switchD_0110edef_default:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"TPZGeoMesh::CreateGeoElement type element not exists:",0x35)
      ;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," type = ",8);
      plVar1 = (long *)std::ostream::operator<<(&std::cerr,type);
      std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
      std::ostream::put((char)plVar1);
      std::ostream::flush();
      this_00 = (TPZGeoElRefPattern<pzgeom::TPZGeoCube> *)0x0;
    }
  }
  return (TPZGeoEl *)this_00;
}

Assistant:

TPZGeoEl *TPZGeoMesh::CreateGeoElement(MElementType type,
                                       TPZVec<int64_t>& nodeindexes,
                                       int matid,
                                       int64_t& index,
                                       int reftype){
    
#ifdef PZDEBUG
    {
        for (int i=0; i<nodeindexes.size(); i++) {
            if (nodeindexes[i] < 0) {
                DebugStop();
            }
        }
    }
#endif
	if (reftype == 0)
    {
        switch( type )
        {
            case 0://point
                return new TPZGeoElement< TPZGeoPoint, TPZRefPoint>(nodeindexes, matid, *this, index );
            case 1://line
                return new TPZGeoElement< TPZGeoLinear, TPZRefLinear>(nodeindexes, matid, *this, index );
            case 2://triangle
                return new TPZGeoElement< TPZGeoTriangle, TPZRefTriangle >(nodeindexes, matid, *this, index );
            case 3://quadrilatera
                return  new TPZGeoElement< TPZGeoQuad, TPZRefQuad >(nodeindexes, matid, *this, index );
            case 4://tetraedra
                return new TPZGeoElement< TPZGeoTetrahedra, TPZRefTetrahedra >(nodeindexes, matid, *this, index );
            case 5:
                return new TPZGeoElement< TPZGeoPyramid, TPZRefPyramid >(nodeindexes, matid, *this, index );
            case 6:
                return new TPZGeoElement< TPZGeoPrism, TPZRefPrism >(nodeindexes, matid, *this, index );
            case 7:
                return new TPZGeoElement< TPZGeoCube, TPZRefCube >(nodeindexes, matid, *this, index );
            default:
                PZError << "TPZGeoMesh::CreateGeoElement type element not exists:"
                << " type = " << type << std::endl;
                return NULL;
        }
    }
	else
	{
		//TPZAutoPointer<TPZRefPattern> ref = GetUniformPattern(type);
		switch( type )
		{
			case 0://point
			{
				TPZGeoElRefPattern<TPZGeoPoint> * gel = new TPZGeoElRefPattern<TPZGeoPoint> (nodeindexes, matid, *this, index);
				return gel;
			}
			case 1://line
			{
				TPZGeoElRefPattern < TPZGeoLinear > *gel = new TPZGeoElRefPattern < TPZGeoLinear >(nodeindexes, matid, *this, index);
				//gel->SetRefPattern (ref);
				return gel;
			}
			case 2://triangle
			{
				TPZGeoElRefPattern < TPZGeoTriangle > *gel = new TPZGeoElRefPattern < TPZGeoTriangle >(nodeindexes, matid, *this, index);
				//gel->SetRefPattern (ref);
				return gel;
			}
			case 3://quadrilatera
			{
				TPZGeoElRefPattern < TPZGeoQuad > * gel = new TPZGeoElRefPattern < TPZGeoQuad >(nodeindexes, matid, *this, index);
				//gel->SetRefPattern (ref);
				return gel;
			}
			case 4://tetraedra
			{
				TPZGeoElRefPattern < TPZGeoTetrahedra > *gel = new TPZGeoElRefPattern < TPZGeoTetrahedra >(nodeindexes, matid, *this, index);
				//gel->SetRefPattern (ref);
				return gel;
			}
			case 5://pyramid
			{
				TPZGeoElRefPattern < TPZGeoPyramid > *gel = new TPZGeoElRefPattern < TPZGeoPyramid >(nodeindexes, matid, *this, index);
				//gel->SetRefPattern (ref);
				return gel;
			}
			case 6://prism
			{
				TPZGeoElRefPattern < TPZGeoPrism > *gel = new TPZGeoElRefPattern < TPZGeoPrism >(nodeindexes, matid, *this, index);
				//gel->SetRefPattern (ref);
				return gel;
			}
			case 7://cube
			{
				TPZGeoElRefPattern < TPZGeoCube > *gel = new TPZGeoElRefPattern < TPZGeoCube >(nodeindexes, matid, *this, index);
				//gel->SetRefPattern (ref);
				return gel;
			}
			default:
			{
				PZError << "TPZGeoMesh::CreateGeoElement type element not exists:"
                << " type = " << type << std::endl;
				return NULL;
			}
		}
	}
	//return NULL;
}